

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_float_Test::
~ByteBufferTest_test_read_write_float_Test(ByteBufferTest_test_read_write_float_Test *this)

{
  ByteBufferTest_test_read_write_float_Test *this_local;
  
  ~ByteBufferTest_test_read_write_float_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_float)
{
    float float1 = 4334.32f;
    ByteBuffer byte_buffer1(4);
    byte_buffer1.WriteFloat(float1);
    EXPECT_EQ(float1, byte_buffer1.ReadFloat());

    float float2 = -435.32f;
    ByteBuffer byte_buffer2(4);
    byte_buffer2.WriteFloat(float2);
    EXPECT_EQ(float2, byte_buffer2.ReadFloat());
}